

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

double VP8LBitsEntropy(uint32_t *array,int n)

{
  double dVar1;
  VP8LBitEntropy entropy;
  VP8LBitEntropy local_20;
  
  VP8LBitsEntropyUnrefined(array,n,&local_20);
  dVar1 = BitsEntropyRefine(&local_20);
  return dVar1;
}

Assistant:

double VP8LBitsEntropy(const uint32_t* const array, int n) {
  VP8LBitEntropy entropy;
  VP8LBitsEntropyUnrefined(array, n, &entropy);

  return BitsEntropyRefine(&entropy);
}